

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

xmlNodePtr
xmlXIncludeCopyXPointer
          (xmlXIncludeCtxtPtr ctxt,xmlDocPtr target,xmlDocPtr source,xmlXPathObjectPtr obj)

{
  xmlXPathObjectType xVar1;
  xmlElementType xVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr pxVar7;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  xmlNodePtr elem;
  ulong uVar10;
  long lVar11;
  int iVar12;
  xmlChar *pxVar13;
  xmlDocPtr pxVar14;
  _xmlNode *node;
  int iVar15;
  int local_6c;
  xmlDocPtr local_68;
  ulong local_60;
  xmlNodePtr local_58;
  int local_4c;
  xmlNodePtr local_48;
  xmlNodePtr local_40;
  int local_34;
  
  if (source == (xmlDocPtr)0x0) {
    source = ctxt->doc;
  }
  if (obj == (xmlXPathObjectPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (target == (xmlDocPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  if (source == (xmlDocPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  xVar1 = obj->type;
  local_68 = target;
  if (xVar1 == XPATH_LOCATIONSET) {
    pxVar8 = (xmlNodePtr)obj->user;
    local_48 = pxVar8;
    if ((pxVar8 == (xmlNodePtr)0x0) || (*(int *)&pxVar8->_private < 1)) {
      pxVar7 = (xmlNodePtr)0x0;
    }
    else {
      lVar11 = 0;
      pxVar7 = (xmlNodePtr)0x0;
      pxVar6 = (xmlNodePtr)0x0;
      do {
        if (pxVar6 == (xmlNodePtr)0x0) {
          pxVar7 = xmlXIncludeCopyXPointer
                             (ctxt,local_68,source,
                              (xmlXPathObjectPtr)(*(xmlNodePtr **)&pxVar8->type)[lVar11]);
          pxVar6 = pxVar7;
        }
        else {
          pxVar9 = xmlXIncludeCopyXPointer
                             (ctxt,local_68,source,
                              (xmlXPathObjectPtr)(*(xmlNodePtr **)&pxVar8->type)[lVar11]);
          xmlAddNextSibling(pxVar6,pxVar9);
        }
        pxVar9 = pxVar6;
        if (pxVar6 == (xmlNodePtr)0x0) {
          pxVar6 = (xmlNodePtr)0x0;
        }
        else {
          do {
            pxVar6 = pxVar9;
            pxVar9 = pxVar6->next;
          } while (pxVar6->next != (_xmlNode *)0x0);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *(int *)&pxVar8->_private);
    }
  }
  else {
    if (xVar1 == XPATH_RANGE) {
      local_6c = 0;
      local_68 = (xmlDocPtr)obj->user;
      if (local_68 == (xmlDocPtr)0x0) {
        return (xmlNodePtr)0x0;
      }
      if (((xmlNodePtr)local_68)->type == XML_NAMESPACE_DECL) {
        return (xmlNodePtr)0x0;
      }
      local_48 = (xmlNodePtr)obj->user2;
      if (local_48 == (xmlNodePtr)0x0) {
        pxVar8 = xmlDocCopyNode((xmlNodePtr)local_68,target,1);
        return pxVar8;
      }
      if (local_48->type == XML_NAMESPACE_DECL) {
        return (xmlNodePtr)0x0;
      }
      local_60 = (ulong)(uint)obj->index;
      local_4c = obj->index2;
      local_58 = (xmlNodePtr)
                 CONCAT44(local_58._4_4_,(int)CONCAT71((uint7)(uint3)((uint)local_4c >> 8),1));
      iVar15 = 0;
      pxVar8 = (xmlNodePtr)0x0;
      node = (_xmlNode *)0x0;
      pxVar7 = (xmlNodePtr)0x0;
      local_40 = (xmlNodePtr)local_68;
      local_34 = 0;
      do {
        while( true ) {
          pxVar6 = pxVar7;
          iVar12 = iVar15;
          if (local_6c < 0) {
            do {
              pxVar6 = xmlDocCopyNode(node,target,2);
              xmlAddChild(pxVar6,pxVar8);
              node = node->parent;
              iVar15 = local_6c + 1;
              bVar3 = local_6c < -1;
              pxVar8 = pxVar6;
              local_6c = iVar15;
            } while (bVar3);
            iVar12 = 0;
            iVar15 = iVar12;
          }
          for (; pxVar14 = local_68, iVar4 = local_6c, local_6c < iVar12; iVar12 = iVar12 + -1) {
            pxVar6 = pxVar6->parent;
            iVar15 = local_6c;
          }
          iVar12 = (int)local_60;
          if (local_68 != (xmlDocPtr)local_48) break;
          local_58 = pxVar8;
          if (local_68->type == XML_TEXT_NODE) {
            if (local_68->intSubset == (_xmlDtd *)0x0) {
              pxVar13 = (xmlChar *)0x0;
              iVar12 = 0;
            }
            else {
              uVar5 = iVar12 - 1;
              uVar10 = (ulong)uVar5;
              if (local_68 != (xmlDocPtr)local_40 || iVar12 < 2) {
                uVar5 = 0;
                uVar10 = 0;
              }
              pxVar13 = (xmlChar *)((long)local_68->intSubset + uVar10);
              iVar12 = local_4c - uVar5;
            }
            pxVar8 = xmlNewTextLen(pxVar13,iVar12);
            if (local_58 != (xmlNodePtr)0x0) {
              if (local_6c != iVar15) {
                xmlAddChild(pxVar6,pxVar8);
                return local_58;
              }
              xmlAddNextSibling(pxVar6,pxVar8);
              return local_58;
            }
            return pxVar8;
          }
          pxVar7 = xmlDocCopyNode((xmlNodePtr)local_68,target,2);
          if (local_58 == (xmlNodePtr)0x0) {
            node = pxVar14->parent;
            pxVar8 = pxVar7;
          }
          else if (local_6c == iVar15) {
            xmlAddNextSibling(pxVar6,pxVar7);
            pxVar8 = local_58;
            pxVar14 = local_68;
          }
          else {
            xmlAddChild(pxVar6,pxVar7);
            pxVar8 = local_58;
            pxVar14 = local_68;
            iVar15 = local_6c;
          }
          if (1 < local_4c) {
            local_48 = xmlXIncludeGetNthChild((xmlNodePtr)pxVar14,local_4c + -1);
            local_4c = 0;
            pxVar14 = local_68;
          }
          if ((pxVar14 == (xmlDocPtr)local_40) && (1 < (int)local_60)) {
            local_68 = (xmlDocPtr)xmlXIncludeGetNthChild((xmlNodePtr)pxVar14,(int)local_60 + -1);
            local_60 = 0;
          }
          else {
            local_68 = (xmlDocPtr)((xmlNodePtr)pxVar14)->children;
          }
          local_6c = local_6c + 1;
          local_58 = (xmlNodePtr)((ulong)local_58 & 0xffffffff00000000);
          local_34 = iVar4;
          if (local_68 == (xmlDocPtr)0x0) {
            return pxVar8;
          }
        }
        if (local_68 == (xmlDocPtr)local_40) {
          if (local_68->type - XML_TEXT_NODE < 2) {
            pxVar13 = (xmlChar *)local_68->intSubset;
            if (pxVar13 == (xmlChar *)0x0) {
              pxVar8 = xmlNewTextLen((xmlChar *)0x0,0);
            }
            else {
              uVar10 = local_60 & 0xffffffff;
              local_60 = local_60 & 0xffffffff;
              if (1 < iVar12) {
                local_60 = 0;
                pxVar13 = pxVar13 + (uVar10 - 1);
              }
              pxVar8 = xmlNewText(pxVar13);
            }
            node = local_68->parent;
            pxVar6 = pxVar8;
            goto LAB_0019cb72;
          }
          pxVar8 = xmlDocCopyNode((xmlNodePtr)local_68,target,2);
          node = local_68->parent;
          pxVar6 = pxVar8;
          if ((int)local_60 < 2) goto LAB_0019cb72;
          local_68 = (xmlDocPtr)xmlXIncludeGetNthChild((xmlNodePtr)local_68,(int)local_60 + -1);
          local_6c = 1;
          iVar15 = 1;
          local_60 = 0;
          pxVar7 = pxVar8;
        }
        else {
          uVar5 = local_68->type - XML_ATTRIBUTE_NODE;
          if ((uVar5 < 0x13) && ((0x6f011U >> (uVar5 & 0x1f) & 1) != 0)) {
            pxVar7 = (xmlNodePtr)0x0;
          }
          else {
            pxVar7 = xmlDocCopyNode((xmlNodePtr)local_68,target,2);
          }
          if (pxVar7 != (xmlNodePtr)0x0) {
            if (local_6c == iVar15) {
              xmlAddNextSibling(pxVar6,pxVar7);
              pxVar6 = pxVar7;
            }
            else {
              xmlAddChild(pxVar6,pxVar7);
              pxVar6 = pxVar7;
              iVar15 = local_6c;
            }
          }
LAB_0019cb72:
          local_68 = (xmlDocPtr)xmlXPtrAdvanceNode((xmlNodePtr)local_68,&local_6c);
          pxVar7 = pxVar6;
          if (local_34 <= local_6c && ((ulong)local_58 & 1) == 0) {
            return pxVar8;
          }
        }
        if (local_68 == (xmlDocPtr)0x0) {
          return pxVar8;
        }
      } while( true );
    }
    if (xVar1 != XPATH_NODESET) {
      return (xmlNodePtr)0x0;
    }
    local_48 = (xmlNodePtr)obj->nodesetval;
    if ((local_48 == (xmlNodePtr)0x0) || (*(int *)&local_48->_private < 1)) {
      pxVar7 = (xmlNodePtr)0x0;
    }
    else {
      lVar11 = 0;
      pxVar8 = (xmlNodePtr)0x0;
      pxVar6 = (xmlNodePtr)0x0;
      do {
        pxVar14 = (xmlDocPtr)(*(xmlNodePtr **)&local_48->type)[lVar11];
        pxVar7 = pxVar8;
        pxVar9 = pxVar6;
        if (pxVar14 != (xmlDocPtr)0x0) {
          xVar2 = pxVar14->type;
          elem = local_48;
          if (xVar2 < XML_XINCLUDE_END) {
            elem = (xmlNodePtr)&DAT_0007dc04;
            if ((0x7dc04U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
              if (xVar2 != XML_XINCLUDE_START) goto LAB_0019c950;
              for (pxVar14 = (xmlDocPtr)pxVar14->next; pxVar14 != (xmlDocPtr)0x0;
                  pxVar14 = (xmlDocPtr)pxVar14->next) {
                uVar5 = pxVar14->type - XML_TEXT_NODE;
                if ((5 < uVar5) && (pxVar14->type != XML_ELEMENT_NODE)) break;
                pxVar6 = xmlXIncludeCopyNode((xmlXIncludeCtxtPtr)local_68,source,pxVar14,
                                             (xmlNodePtr)(ulong)uVar5);
                pxVar8 = pxVar6;
                if (pxVar9 != (xmlNodePtr)0x0) {
                  xmlAddNextSibling(pxVar9,pxVar6);
                  pxVar8 = pxVar7;
                }
                pxVar7 = pxVar8;
                pxVar9 = pxVar6;
              }
            }
          }
          else {
LAB_0019c950:
            pxVar7 = xmlXIncludeCopyNode((xmlXIncludeCtxtPtr)local_68,source,pxVar14,elem);
            pxVar9 = pxVar7;
            if (pxVar6 != (xmlNodePtr)0x0) {
              xmlAddNextSibling(pxVar6,pxVar7);
              pxVar7 = pxVar8;
              pxVar9 = pxVar6->next;
              if (pxVar6->next == (xmlNodePtr)0x0) {
                pxVar9 = pxVar6;
              }
            }
          }
        }
        lVar11 = lVar11 + 1;
        pxVar8 = pxVar7;
        pxVar6 = pxVar9;
      } while (lVar11 < *(int *)&local_48->_private);
    }
  }
  if (local_48 == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  return pxVar7;
}

Assistant:

static xmlNodePtr
xmlXIncludeCopyXPointer(xmlXIncludeCtxtPtr ctxt, xmlDocPtr target,
	                xmlDocPtr source, xmlXPathObjectPtr obj) {
    xmlNodePtr list = NULL, last = NULL;
    int i;

    if (source == NULL)
	source = ctxt->doc;
    if ((ctxt == NULL) || (target == NULL) || (source == NULL) ||
	(obj == NULL))
	return(NULL);
    switch (obj->type) {
        case XPATH_NODESET: {
	    xmlNodeSetPtr set = obj->nodesetval;
	    if (set == NULL)
		return(NULL);
	    for (i = 0;i < set->nodeNr;i++) {
		if (set->nodeTab[i] == NULL)
		    continue;
		switch (set->nodeTab[i]->type) {
		    case XML_TEXT_NODE:
		    case XML_CDATA_SECTION_NODE:
		    case XML_ELEMENT_NODE:
		    case XML_ENTITY_REF_NODE:
		    case XML_ENTITY_NODE:
		    case XML_PI_NODE:
		    case XML_COMMENT_NODE:
		    case XML_DOCUMENT_NODE:
		    case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
		    case XML_DOCB_DOCUMENT_NODE:
#endif
		    case XML_XINCLUDE_END:
			break;
		    case XML_XINCLUDE_START: {
	                xmlNodePtr tmp, cur = set->nodeTab[i];

			cur = cur->next;
			while (cur != NULL) {
			    switch(cur->type) {
				case XML_TEXT_NODE:
				case XML_CDATA_SECTION_NODE:
				case XML_ELEMENT_NODE:
				case XML_ENTITY_REF_NODE:
				case XML_ENTITY_NODE:
				case XML_PI_NODE:
				case XML_COMMENT_NODE:
				    tmp = xmlXIncludeCopyNode(ctxt, target,
							      source, cur);
				    if (last == NULL) {
					list = last = tmp;
				    } else {
					xmlAddNextSibling(last, tmp);
					last = tmp;
				    }
				    cur = cur->next;
				    continue;
				default:
				    break;
			    }
			    break;
			}
			continue;
		    }
		    case XML_ATTRIBUTE_NODE:
		    case XML_NAMESPACE_DECL:
		    case XML_DOCUMENT_TYPE_NODE:
		    case XML_DOCUMENT_FRAG_NODE:
		    case XML_NOTATION_NODE:
		    case XML_DTD_NODE:
		    case XML_ELEMENT_DECL:
		    case XML_ATTRIBUTE_DECL:
		    case XML_ENTITY_DECL:
			continue; /* for */
		}
		if (last == NULL)
		    list = last = xmlXIncludeCopyNode(ctxt, target, source,
			                              set->nodeTab[i]);
		else {
		    xmlAddNextSibling(last,
			    xmlXIncludeCopyNode(ctxt, target, source,
				                set->nodeTab[i]));
		    if (last->next != NULL)
			last = last->next;
		}
	    }
	    break;
	}
#ifdef LIBXML_XPTR_ENABLED
	case XPATH_LOCATIONSET: {
	    xmlLocationSetPtr set = (xmlLocationSetPtr) obj->user;
	    if (set == NULL)
		return(NULL);
	    for (i = 0;i < set->locNr;i++) {
		if (last == NULL)
		    list = last = xmlXIncludeCopyXPointer(ctxt, target, source,
			                                  set->locTab[i]);
		else
		    xmlAddNextSibling(last,
			    xmlXIncludeCopyXPointer(ctxt, target, source,
				                    set->locTab[i]));
		if (last != NULL) {
		    while (last->next != NULL)
			last = last->next;
		}
	    }
	    break;
	}
	case XPATH_RANGE:
	    return(xmlXIncludeCopyRange(ctxt, target, source, obj));
#endif
	case XPATH_POINT:
	    /* points are ignored in XInclude */
	    break;
	default:
	    break;
    }
    return(list);
}